

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolAppend(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  XML_Bool XVar1;
  int iVar2;
  XML_Convert_Result convert_res;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  STRING_POOL *pool_local;
  
  end_local = ptr;
  ptr_local = (char *)enc;
  enc_local = (ENCODING *)pool;
  if (pool->ptr != (XML_Char *)0x0) goto LAB_00b032ec;
  XVar1 = poolGrow(pool);
  while( true ) {
    if (XVar1 == '\0') {
      return (XML_Char *)0x0;
    }
LAB_00b032ec:
    iVar2 = (**(code **)(ptr_local + 0x68))
                      (ptr_local,&end_local,end,enc_local->literalScanners,enc_local->scanners[2]);
    if ((iVar2 == 0) || (iVar2 == 1)) break;
    XVar1 = poolGrow((STRING_POOL *)enc_local);
  }
  return (XML_Char *)enc_local->literalScanners[1];
}

Assistant:

static XML_Char *
poolAppend(STRING_POOL *pool, const ENCODING *enc, const char *ptr,
           const char *end) {
  if (! pool->ptr && ! poolGrow(pool))
    return NULL;
  for (;;) {
    const enum XML_Convert_Result convert_res = XmlConvert(
        enc, &ptr, end, (ICHAR **)&(pool->ptr), (ICHAR *)pool->end);
    if ((convert_res == XML_CONVERT_COMPLETED)
        || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
      break;
    if (! poolGrow(pool))
      return NULL;
  }
  return pool->start;
}